

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O3

void test_ADynArray_buffer_valid_fn(int _i)

{
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0xaf);
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0xb1);
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0xb3);
  return;
}

Assistant:

START_TEST(test_ADynArray_buffer_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {nullptr, nullptr};
    array.size = 0;
    array.capacity = 0;
    array.buffer = (char*) 42;
    ACUTILSTEST_ASSERT_PTR_EQ(ADynArray_buffer(&array), (char*) 42);
    array.buffer = (char*) 13;
    ACUTILSTEST_ASSERT_PTR_EQ(ADynArray_buffer(&array), (char*) 13);
    array.buffer = nullptr;
    ACUTILSTEST_ASSERT_PTR_NULL(ADynArray_buffer(&array));
}